

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::parseClipInfo(CLPIParser *this,BitStreamReader *reader)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  int local_1c;
  int i;
  BitStreamReader *reader_local;
  CLPIParser *this_local;
  
  BitStreamReader::skipBits(reader,0x20);
  BitStreamReader::skipBits(reader,0x10);
  uVar1 = BitStreamReader::getBits<unsigned_char>(reader,8);
  this->clip_stream_type = uVar1;
  uVar1 = BitStreamReader::getBits<unsigned_char>(reader,8);
  this->application_type = uVar1;
  BitStreamReader::skipBits(reader,0x1f);
  bVar2 = BitStreamReader::getBit(reader);
  this->is_ATC_delta = bVar2;
  uVar3 = BitStreamReader::getBits(reader,0x20);
  this->TS_recording_rate = uVar3;
  uVar3 = BitStreamReader::getBits(reader,0x20);
  this->number_of_source_packets = uVar3;
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    BitStreamReader::skipBits(reader,0x20);
  }
  TS_type_info_block(this,reader);
  return;
}

Assistant:

void CLPIParser::parseClipInfo(BitStreamReader& reader)
{
    reader.skipBits(32);                            // length
    reader.skipBits(16);                            // reserved_for_future_use
    clip_stream_type = reader.getBits<uint8_t>(8);  // 1 - AV stream
    application_type = reader.getBits<uint8_t>(8);  // 1 - Main TS for a main-path of Movie
    reader.skipBits(31);                            // reserved_for_future_use
    is_ATC_delta = reader.getBit();
    TS_recording_rate = reader.getBits(32);         // kbps in bytes/sec
    number_of_source_packets = reader.getBits(32);  // number of TS packets?
    for (int i = 0; i < 32; i++) reader.skipBits(32);
    TS_type_info_block(reader);
}